

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          string *err)

{
  FILE *pFVar1;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  bool bVar2;
  Edge *edge_00;
  undefined8 uVar3;
  ulong uVar4;
  Edge *pEVar5;
  size_t index;
  TimeStamp TVar6;
  TimeStamp TVar7;
  reference ppNVar8;
  reference ppNVar9;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_88;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_80;
  iterator o_1;
  Edge *in_edge;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  iterator i;
  Node *most_recent_input;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_48;
  iterator o;
  bool dirty;
  Edge *edge;
  string *err_local;
  vector<Node_*,_std::allocator<Node_*>_> *stack_local;
  Node *node_local;
  DependencyScan *this_local;
  
  stack_local = (vector<Node_*,_std::allocator<Node_*>_> *)node;
  node_local = (Node *)this;
  edge_00 = Node::in_edge(node);
  if (edge_00 == (Edge *)0x0) {
    bVar2 = Node::status_known((Node *)stack_local);
    if (bVar2) {
      return true;
    }
    bVar2 = Node::StatIfNecessary((Node *)stack_local,this->disk_interface_,err);
    if (!bVar2) {
      return false;
    }
    bVar2 = Node::exists((Node *)stack_local);
    pFVar1 = _stderr;
    if ((!bVar2) && ((g_explaining & 1U) != 0)) {
      Node::path_abi_cxx11_((Node *)stack_local);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"ninja explain: %s has no in-edge and is missing\n",uVar3);
    }
    this_00 = stack_local;
    bVar2 = Node::exists((Node *)stack_local);
    Node::set_dirty((Node *)this_00,(bool)((bVar2 ^ 0xffU) & 1));
    return true;
  }
  if (edge_00->mark_ == VisitDone) {
    return true;
  }
  bVar2 = VerifyDAG(this,(Node *)stack_local,stack,err);
  if (!bVar2) {
    return false;
  }
  edge_00->mark_ = VisitInStack;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(stack,(value_type *)&stack_local);
  o._M_current._7_1_ = 0;
  edge_00->outputs_ready_ = true;
  edge_00->deps_missing_ = false;
  if ((((edge_00->deps_loaded_ & 1U) == 0) && (edge_00->dyndep_ != (Node *)0x0)) &&
     (bVar2 = Node::dyndep_pending(edge_00->dyndep_), bVar2)) {
    bVar2 = RecomputeDirty(this,edge_00->dyndep_,stack,err);
    if (!bVar2) {
      return false;
    }
    pEVar5 = Node::in_edge(edge_00->dyndep_);
    if (pEVar5 != (Edge *)0x0) {
      pEVar5 = Node::in_edge(edge_00->dyndep_);
      bVar2 = Edge::outputs_ready(pEVar5);
      if (!bVar2) goto LAB_00130d5a;
    }
    bVar2 = LoadDyndeps(this,edge_00->dyndep_,err);
    if (!bVar2) {
      return false;
    }
  }
LAB_00130d5a:
  local_48._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge_00->outputs_);
  while( true ) {
    most_recent_input =
         (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge_00->outputs_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       &most_recent_input);
    if (!bVar2) break;
    ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_48);
    bVar2 = Node::StatIfNecessary(*ppNVar8,this->disk_interface_,err);
    if (!bVar2) {
      return false;
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_48);
  }
  if ((edge_00->deps_loaded_ & 1U) == 0) {
    edge_00->deps_loaded_ = true;
    bVar2 = ImplicitDepLoader::LoadDeps(&this->dep_loader_,edge_00,err);
    if (!bVar2) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        return false;
      }
      edge_00->deps_missing_ = true;
      o._M_current._7_1_ = 1;
    }
  }
  i._M_current = (Node **)0x0;
  local_60._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge_00->inputs_);
  do {
    in_edge = (Edge *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge_00->inputs_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       &in_edge);
    if (!bVar2) {
      if (((o._M_current._7_1_ & 1) != 0) ||
         (bVar2 = RecomputeOutputsDirty
                            (this,edge_00,(Node *)i._M_current,(bool *)((long)&o._M_current + 7),err
                            ), bVar2)) {
        local_80._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge_00->outputs_);
        while( true ) {
          local_88._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge_00->outputs_);
          bVar2 = __gnu_cxx::operator!=(&local_80,&local_88);
          if (!bVar2) break;
          if ((o._M_current._7_1_ & 1) != 0) {
            ppNVar8 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&local_80);
            Node::MarkDirty(*ppNVar8);
          }
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator++(&local_80);
        }
        if (((o._M_current._7_1_ & 1) != 0) &&
           ((bVar2 = Edge::is_phony(edge_00), !bVar2 ||
            (bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&edge_00->inputs_), !bVar2)
            ))) {
          edge_00->outputs_ready_ = false;
        }
        edge_00->mark_ = VisitDone;
        ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::back(stack);
        if (*ppNVar9 != (value_type)stack_local) {
          __assert_fail("stack->back() == node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph.cc"
                        ,0xaa,
                        "bool DependencyScan::RecomputeDirty(Node *, vector<Node *> *, string *)");
        }
        std::vector<Node_*,_std::allocator<Node_*>_>::pop_back(stack);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_60);
    bVar2 = RecomputeDirty(this,*ppNVar8,stack,err);
    if (!bVar2) {
      return false;
    }
    ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_60);
    pEVar5 = Node::in_edge(*ppNVar8);
    if ((pEVar5 != (Edge *)0x0) && ((pEVar5->outputs_ready_ & 1U) == 0)) {
      edge_00->outputs_ready_ = false;
    }
    o_1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge_00->inputs_);
    index = __gnu_cxx::operator-(&local_60,&o_1);
    bVar2 = Edge::is_order_only(edge_00,index);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_60);
      bVar2 = Node::dirty(*ppNVar8);
      pFVar1 = _stderr;
      if (bVar2) {
        if ((g_explaining & 1U) != 0) {
          ppNVar8 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_60);
          Node::path_abi_cxx11_(*ppNVar8);
          uVar3 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"ninja explain: %s is dirty\n",uVar3);
        }
        o._M_current._7_1_ = 1;
      }
      else {
        if (i._M_current != (Node **)0x0) {
          ppNVar8 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_60);
          TVar6 = Node::mtime(*ppNVar8);
          TVar7 = Node::mtime((Node *)i._M_current);
          if (TVar6 <= TVar7) goto LAB_00130fb4;
        }
        ppNVar8 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_60);
        i._M_current = (Node **)*ppNVar8;
      }
    }
LAB_00130fb4:
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_60);
  } while( true );
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* node, vector<Node*>* stack,
                                    string* err) {
  Edge* edge = node->in_edge();
  if (!edge) {
    // If we already visited this leaf node then we are done.
    if (node->status_known())
      return true;
    // This node has no in-edge; it is dirty if it is missing.
    if (!node->StatIfNecessary(disk_interface_, err))
      return false;
    if (!node->exists())
      EXPLAIN("%s has no in-edge and is missing", node->path().c_str());
    node->set_dirty(!node->exists());
    return true;
  }

  // If we already finished this edge then we are done.
  if (edge->mark_ == Edge::VisitDone)
    return true;

  // If we encountered this edge earlier in the call stack we have a cycle.
  if (!VerifyDAG(node, stack, err))
    return false;

  // Mark the edge temporarily while in the call stack.
  edge->mark_ = Edge::VisitInStack;
  stack->push_back(node);

  bool dirty = false;
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.
    // If there is a pending dyndep file, visit it now:
    // * If the dyndep file is ready then load it now to get any
    //   additional inputs and outputs for this and other edges.
    //   Once the dyndep file is loaded it will no longer be pending
    //   if any other edges encounter it, but they will already have
    //   been updated.
    // * If the dyndep file is not ready then since is known to be an
    //   input to this edge, the edge will not be considered ready below.
    //   Later during the build the dyndep file will become ready and be
    //   loaded to update this edge before it can possibly be scheduled.
    if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
      if (!RecomputeDirty(edge->dyndep_, stack, err))
        return false;

      if (!edge->dyndep_->in_edge() ||
          edge->dyndep_->in_edge()->outputs_ready()) {
        // The dyndep file is ready, so load it now.
        if (!LoadDyndeps(edge->dyndep_, err))
          return false;
      }
    }
  }

  // Load output mtimes so we can compare them to the most recent input below.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!(*o)->StatIfNecessary(disk_interface_, err))
      return false;
  }

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.  Load discovered deps.
    edge->deps_loaded_ = true;
    if (!dep_loader_.LoadDeps(edge, err)) {
      if (!err->empty())
        return false;
      // Failed to load dependency info: rebuild to regenerate it.
      // LoadDeps() did EXPLAIN() already, no need to do it here.
      dirty = edge->deps_missing_ = true;
    }
  }

  // Visit all inputs; we're dirty if any of the inputs are dirty.
  Node* most_recent_input = NULL;
  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    // Visit this input.
    if (!RecomputeDirty(*i, stack, err))
      return false;

    // If an input is not ready, neither are our outputs.
    if (Edge* in_edge = (*i)->in_edge()) {
      if (!in_edge->outputs_ready_)
        edge->outputs_ready_ = false;
    }

    if (!edge->is_order_only(i - edge->inputs_.begin())) {
      // If a regular input is dirty (or missing), we're dirty.
      // Otherwise consider mtime.
      if ((*i)->dirty()) {
        EXPLAIN("%s is dirty", (*i)->path().c_str());
        dirty = true;
      } else {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime()) {
          most_recent_input = *i;
        }
      }
    }
  }

  // We may also be dirty due to output state: missing outputs, out of
  // date outputs, etc.  Visit all outputs and determine whether they're dirty.
  if (!dirty)
    if (!RecomputeOutputsDirty(edge, most_recent_input, &dirty, err))
      return false;

  // Finally, visit each output and update their dirty state if necessary.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (dirty)
      (*o)->MarkDirty();
  }

  // If an edge is dirty, its outputs are normally not ready.  (It's
  // possible to be clean but still not be ready in the presence of
  // order-only inputs.)
  // But phony edges with no inputs have nothing to do, so are always
  // ready.
  if (dirty && !(edge->is_phony() && edge->inputs_.empty()))
    edge->outputs_ready_ = false;

  // Mark the edge as finished during this walk now that it will no longer
  // be in the call stack.
  edge->mark_ = Edge::VisitDone;
  assert(stack->back() == node);
  stack->pop_back();

  return true;
}